

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::dumpUnicodeCharacter(Dumper *this,uint16_t value)

{
  byte bVar1;
  char cVar2;
  short sVar3;
  ushort uVar4;
  uint uVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  ushort in_SI;
  long in_RDI;
  uint16_t p;
  int local_44;
  
  (**(code **)(**(long **)(in_RDI + 8) + 0x18))(*(long **)(in_RDI + 8),"\\u",2);
  bVar1 = (byte)(in_SI >> 8);
  if (in_SI >> 0xc < 10) {
    cVar2 = (bVar1 >> 4) + 0x30;
  }
  else {
    cVar2 = (bVar1 >> 4) + 0x37;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),cVar2,extraout_RDX,cVar2);
  uVar4 = in_SI >> 8 & 0xf;
  cVar2 = (char)uVar4;
  if (uVar4 < 10) {
    cVar2 = cVar2 + '0';
  }
  else {
    cVar2 = cVar2 + '7';
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),cVar2,extraout_RDX_00,cVar2);
  uVar5 = (in_SI & 0xf0) >> 4;
  if ((ushort)uVar5 < 10) {
    local_44 = uVar5 + 0x30;
  }
  else {
    local_44 = uVar5 + 0x37;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))
            (*(long **)(in_RDI + 8),(char)local_44,extraout_RDX_01,local_44);
  uVar4 = in_SI & 0xf;
  if (uVar4 < 10) {
    sVar3 = uVar4 + 0x30;
  }
  else {
    sVar3 = uVar4 + 0x37;
  }
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))
            (*(long **)(in_RDI + 8),(char)sVar3,extraout_RDX_02,sVar3);
  return;
}

Assistant:

void Dumper::dumpUnicodeCharacter(uint16_t value) {
  _sink->append("\\u", 2);

  uint16_t p;
  p = (value & 0xf000U) >> 12;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x0f00U) >> 8;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x00f0U) >> 4;
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));

  p = (value & 0x000fU);
  _sink->push_back((p < 10) ? ('0' + p) : ('A' + p - 10));
}